

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

Expression_node * __thiscall
lossless_neural_sound::expression_compiler::expression::Transfer_function::
get_derivative_implementation(Transfer_function *this,Arena *arena,Nodes *nodes,Variable *variable)

{
  Expression_node *pEVar1;
  Transfer_function *local_80;
  Expression_node *local_78;
  Transfer_function local_70;
  
  local_70.arg = this->arg;
  local_70.derivative_count = this->derivative_count + 1;
  local_70.super_Expression_node.aa_tree_node.left_child = (Expression_node *)0x0;
  local_70.super_Expression_node.aa_tree_node.right_child = (Expression_node *)0x0;
  local_70.super_Expression_node.super_Node.hash_next = (Node *)0x0;
  local_70.super_Expression_node.aa_tree_node.parent = (Expression_node *)0x0;
  local_70.super_Expression_node.aa_tree_node.tree_size = 1;
  local_70.super_Expression_node.aa_tree_node.tree_level = 1;
  local_70.super_Expression_node.super_Node._vptr_Node = (_func_int **)&PTR__Node_0012ed00;
  local_80 = Nodes::
             intern<lossless_neural_sound::expression_compiler::expression::Transfer_function>
                       (nodes,arena,&local_70);
  local_78 = Expression_node::get_derivative(this->arg,arena,nodes,variable);
  pEVar1 = Product::make(arena,nodes,(Expression_node **)&local_80,2);
  return pEVar1;
}

Assistant:

virtual const Expression_node *get_derivative_implementation(
        Arena &arena, Nodes &nodes, const Variable *variable) const override
    {
        return Product::make(arena,
                             nodes,
                             {nodes.intern(arena, Transfer_function(arg, derivative_count + 1)),
                              arg->get_derivative(arena, nodes, variable)});
    }